

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_connect(Curl_easy *data,_Bool *done)

{
  char *value;
  SASL *sasl;
  char cVar1;
  connectdata *pcVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  size_t len;
  char *pcVar6;
  char localhost [1025];
  char local_438 [1032];
  
  pcVar2 = data->conn;
  *done = false;
  CVar4 = CURLE_OK;
  Curl_conncontrol(pcVar2,0);
  (pcVar2->proto).smbc.send_buf = (char *)0x1d4c0;
  (pcVar2->proto).ftpc.pp.statemachine = smtp_statemachine;
  (pcVar2->proto).ftpc.pp.endofresp = smtp_endofresp;
  sasl = &(pcVar2->proto).imapc.sasl;
  Curl_sasl_init(sasl,data,&saslsmtp);
  Curl_pp_init(&(pcVar2->proto).ftpc.pp);
  pcVar6 = pcVar2->options;
  if (pcVar6 != (char *)0x0) {
    cVar1 = *pcVar6;
    CVar4 = CURLE_OK;
    while (pcVar5 = pcVar6, cVar1 != '\0') {
      for (; (*pcVar5 != '\0' && (*pcVar5 != '=')); pcVar5 = pcVar5 + 1) {
      }
      value = pcVar5 + 1;
      len = 0xffffffffffffffff;
      for (; (*pcVar5 != '\0' && (*pcVar5 != ';')); pcVar5 = pcVar5 + 1) {
        len = len + 1;
      }
      iVar3 = curl_strnequal(pcVar6,"AUTH=",5);
      if (iVar3 == 0) {
        CVar4 = CURLE_URL_MALFORMAT;
      }
      else {
        CVar4 = Curl_sasl_parse_url_auth_option(sasl,value,len);
      }
      if (CVar4 != CURLE_OK) break;
      pcVar6 = pcVar5 + (*pcVar5 == ';');
      cVar1 = pcVar5[*pcVar5 == ';'];
    }
  }
  if (CVar4 == CURLE_OK) {
    pcVar2 = data->conn;
    pcVar6 = (data->state).up.path;
    if (pcVar6[1] == '\0') {
      iVar3 = Curl_gethostname(local_438,0x401);
      pcVar6 = "localhost";
      if (iVar3 == 0) {
        pcVar6 = local_438;
      }
    }
    else {
      pcVar6 = pcVar6 + 1;
    }
    CVar4 = Curl_urldecode(pcVar6,0,&(pcVar2->proto).ftpc.newhost,(size_t *)0x0,REJECT_CTRL);
    if (CVar4 == CURLE_OK) {
      smtp_state(data,SMTP_SERVERGREET);
      CVar4 = smtp_multi_statemach(data,done);
    }
  }
  return CVar4;
}

Assistant:

static CURLcode smtp_connect(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in SMTP */
  connkeep(conn, "SMTP default");

  PINGPONG_SETUP(pp, smtp_statemachine, smtp_endofresp);

  /* Initialize the SASL storage */
  Curl_sasl_init(&smtpc->sasl, data, &saslsmtp);

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = smtp_parse_url_options(conn);
  if(result)
    return result;

  /* Parse the URL path */
  result = smtp_parse_url_path(data);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  smtp_state(data, SMTP_SERVERGREET);

  result = smtp_multi_statemach(data, done);

  return result;
}